

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

stCoSysEnvArr_t * dup_co_sysenv_arr(stCoSysEnvArr_t *arr)

{
  stCoSysEnvArr_t *psVar1;
  stCoSysEnv_t *psVar2;
  stCoSysEnvArr_t *lp;
  stCoSysEnvArr_t *arr_local;
  
  psVar1 = (stCoSysEnvArr_t *)calloc(0x10,1);
  if (arr->cnt != 0) {
    psVar2 = (stCoSysEnv_t *)calloc(arr->cnt << 4,1);
    psVar1->data = psVar2;
    psVar1->cnt = arr->cnt;
    memcpy(psVar1->data,arr->data,arr->cnt << 4);
  }
  return psVar1;
}

Assistant:

static stCoSysEnvArr_t *dup_co_sysenv_arr( stCoSysEnvArr_t * arr )
{
	stCoSysEnvArr_t *lp = (stCoSysEnvArr_t*)calloc( sizeof(stCoSysEnvArr_t),1 );	
	if( arr->cnt )
	{
		lp->data = (stCoSysEnv_t*)calloc( sizeof(stCoSysEnv_t) * arr->cnt,1 );
		lp->cnt = arr->cnt;
		memcpy( lp->data,arr->data,sizeof( stCoSysEnv_t ) * arr->cnt );
	}
	return lp;
}